

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-sampling.cpp
# Opt level: O2

void test_typical(vector<float,_std::allocator<float>_> *probs,
                 vector<float,_std::allocator<float>_> *probs_expected,float p)

{
  llama_sampler *sampler;
  sampler_tester tester;
  
  sampler_tester::sampler_tester(&tester,probs,probs_expected);
  printf("%s:%d (%s)\n",
         "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/tests/test-sampling.cpp"
         ,0x84,"test_typical");
  dump(&tester.cur_p);
  puts("-");
  sampler = (llama_sampler *)llama_sampler_init_typical(0x3f000000,1);
  sampler_tester::apply(&tester,sampler);
  printf("%s:%d (%s)\n",
         "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/tests/test-sampling.cpp"
         ,0x86,"test_typical");
  dump(&tester.cur_p);
  puts("-");
  sampler_tester::check(&tester);
  sampler_tester::~sampler_tester(&tester);
  return;
}

Assistant:

static void test_typical(const std::vector<float> & probs, const std::vector<float> & probs_expected, float p) {
    sampler_tester tester(probs, probs_expected);

    DUMP(&tester.cur_p);
    tester.apply(llama_sampler_init_typical(p, 1));
    DUMP(&tester.cur_p);

    tester.check();
}